

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O0

void __thiscall
uWS::TopicTree::TopicTree
          (TopicTree *this,
          function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
          *cb)

{
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  *__x;
  Topic *in_RDI;
  Topic *this_00;
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  std::
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  ::function((function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
              *)in_RDI);
  __x = (function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
         *)operator_new(0xc0);
  Topic::Topic(this_00);
  *(function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
    **)&(in_RDI->children)._M_t._M_impl = __x;
  (this_00->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(undefined4 *)&this_00[2].subs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = 0;
  this_00[2].subs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0xffffffffffffffff;
  std::
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  ::operator=(in_stack_ffffffffffffffe0,__x);
  return;
}

Assistant:

TopicTree(std::function<int(Subscriber *, std::pair<std::string_view, std::string_view>)> cb) {
        this->cb = cb;
    }